

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgGoogol.cpp
# Opt level: O2

void __thiscall dgGoogol::NegateMantissa(dgGoogol *this,HaU64 *mantissa)

{
  long lVar1;
  HaI32 i;
  uint uVar2;
  HaU64 HVar3;
  
  lVar1 = 1;
  for (uVar2 = 3; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    HVar3 = ~mantissa[uVar2] + lVar1;
    if (HVar3 != 0) {
      lVar1 = 0;
    }
    mantissa[uVar2] = HVar3;
  }
  return;
}

Assistant:

void dgGoogol::NegateMantissa (hacd::HaU64* const mantissa) const
{
	hacd::HaU64 carrier = 1;
	for (hacd::HaI32 i = DG_GOOGOL_SIZE - 1; i >= 0; i --) {
		hacd::HaU64 a = ~mantissa[i] + carrier;
		if (a) {
			carrier = 0;
		}
		mantissa[i] = a;
	}
}